

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O2

uint8_t * svb_encode_scalar_d1_init
                    (uint32_t *in,uint8_t *keyPtr,uint8_t *dataPtr,uint32_t count,uint32_t prev)

{
  uint32_t uVar1;
  uint uVar2;
  uint8_t uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint8_t *local_40;
  uint32_t *local_38;
  
  if (count != 0) {
    uVar5 = 0;
    bVar4 = 0;
    local_40 = dataPtr;
    local_38 = in;
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      if ((char)uVar5 == '\b') {
        *keyPtr = bVar4;
        keyPtr = keyPtr + 1;
        uVar5 = 0;
        bVar4 = 0;
      }
      uVar1 = local_38[uVar6];
      uVar3 = _encode_data(uVar1 - prev,&local_40);
      uVar2 = uVar5 & 0x1f;
      uVar5 = (uint)(byte)((char)uVar5 + 2);
      bVar4 = uVar3 << uVar2 | bVar4;
      prev = uVar1;
    }
    *keyPtr = bVar4;
    dataPtr = local_40;
  }
  return dataPtr;
}

Assistant:

uint8_t *svb_encode_scalar_d1_init(const uint32_t *in,
                                   uint8_t *__restrict__ keyPtr,
                                   uint8_t *__restrict__ dataPtr,
                                   uint32_t count, uint32_t prev) {
  if (count == 0)
    return dataPtr; // exit immediately if no data

  uint8_t shift = 0; // cycles 0, 2, 4, 6, 0, 2, 4, 6, ...
  uint8_t key = 0;
  for (uint32_t c = 0; c < count; c++) {
    if (shift == 8) {
      shift = 0;
      *keyPtr++ = key;
      key = 0;
    }
    uint32_t val = in[c] - prev;
    prev = in[c];
    uint8_t code = _encode_data(val, &dataPtr);
    key |= code << shift;
    shift += 2;
  }

  *keyPtr = key;  // write last key (no increment needed)
  return dataPtr; // pointer to first unused data byte
}